

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O1

void __thiscall
spvtools::opt::Loop::Loop
          (Loop *this,IRContext *context,DominatorAnalysis *dom_analysis,BasicBlock *header,
          BasicBlock *continue_target,BasicBlock *merge_target)

{
  BasicBlock *pBVar1;
  
  this->context_ = context;
  this->loop_header_ = header;
  this->loop_continue_ = continue_target;
  this->loop_merge_ = merge_target;
  this->loop_preheader_ = (BasicBlock *)0x0;
  this->parent_ = (Loop *)0x0;
  (this->nested_loops_).
  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nested_loops_).
  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nested_loops_).
  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->loop_basic_blocks_)._M_h._M_buckets = &(this->loop_basic_blocks_)._M_h._M_single_bucket;
  (this->loop_basic_blocks_)._M_h._M_bucket_count = 1;
  (this->loop_basic_blocks_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->loop_basic_blocks_)._M_h._M_element_count = 0;
  (this->loop_basic_blocks_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->loop_basic_blocks_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->loop_basic_blocks_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->loop_is_marked_for_removal_ = false;
  if (context == (IRContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                  ,0xd6,
                  "spvtools::opt::Loop::Loop(IRContext *, DominatorAnalysis *, BasicBlock *, BasicBlock *, BasicBlock *)"
                 );
  }
  if (dom_analysis != (DominatorAnalysis *)0x0) {
    pBVar1 = FindLoopPreheader(this,dom_analysis);
    this->loop_preheader_ = pBVar1;
    pBVar1 = FindLatchBlock(this);
    this->loop_latch_ = pBVar1;
    return;
  }
  __assert_fail("dom_analysis",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                ,0xd7,
                "spvtools::opt::Loop::Loop(IRContext *, DominatorAnalysis *, BasicBlock *, BasicBlock *, BasicBlock *)"
               );
}

Assistant:

Loop::Loop(IRContext* context, DominatorAnalysis* dom_analysis,
           BasicBlock* header, BasicBlock* continue_target,
           BasicBlock* merge_target)
    : context_(context),
      loop_header_(header),
      loop_continue_(continue_target),
      loop_merge_(merge_target),
      loop_preheader_(nullptr),
      parent_(nullptr),
      loop_is_marked_for_removal_(false) {
  assert(context);
  assert(dom_analysis);
  loop_preheader_ = FindLoopPreheader(dom_analysis);
  loop_latch_ = FindLatchBlock();
}